

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O0

bool TestHashList<unsigned_int>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes,bool drawDiagram,
               bool testCollision,bool testDist,bool testHighBits,bool testLowBits)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  uint uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint *puVar10;
  reference pvVar11;
  uint in_ECX;
  uint in_EDX;
  undefined4 in_ESI;
  undefined4 uVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  uint in_R8D;
  byte in_R9B;
  double dVar13;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> revhashes;
  HashSet<unsigned_int> collisions;
  double collcount;
  double expected;
  size_t count;
  bool result;
  undefined2 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1a;
  undefined1 in_stack_ffffffffffffff1b;
  undefined1 in_stack_ffffffffffffff1c;
  undefined1 in_stack_ffffffffffffff1d;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  undefined8 in_stack_ffffffffffffff30;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  uint nbHBits;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes_00;
  int in_stack_ffffffffffffff54;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff70;
  uint *local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  undefined1 in_stack_ffffffffffffffd7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffd8;
  bool local_e;
  
  uVar2 = in_ECX & 1;
  uVar1 = in_R8D & 1;
  local_e = true;
  if ((in_EDX & 1) != 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI);
    nbHBits = 0x20;
    dVar13 = EstimateNbCollisions
                       ((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                        (int)in_stack_ffffffffffffff30);
    printf("Testing collisions (%3i-bit) - Expected %6.1f, ",dVar13,(ulong)nbHBits);
    hashes_00 = &local_58;
    HashSet<unsigned_int>::HashSet((HashSet<unsigned_int> *)0x1370c3);
    uVar12 = (undefined4)((ulong)hashes_00 >> 0x20);
    iVar9 = FindCollisions<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       CONCAT44(in_ESI,in_EDX),(HashSet<unsigned_int> *)CONCAT44(in_ECX,in_R8D),
                       in_stack_ffffffffffffff54);
    in_stack_ffffffffffffffd8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(double)iVar9
    ;
    printf("actual %6i (%.2fx)",(double)in_stack_ffffffffffffffd8 / dVar13,
           CONCAT44(uVar12,(int)(double)in_stack_ffffffffffffffd8));
    local_e = 2.0 < (double)in_stack_ffffffffffffffd8 / dVar13;
    if (local_e) {
      printf(" !!!!!");
    }
    local_e = !local_e;
    printf("\n");
    fflush((FILE *)0x0);
    if (uVar1 != 0) {
      bVar3 = CountHighbitsCollisions<unsigned_int>(hashes_00,nbHBits);
      bVar4 = CountHighbitsCollisions<unsigned_int>(hashes_00,nbHBits);
      bVar5 = CountHighbitsCollisions<unsigned_int>(hashes_00,nbHBits);
      bVar6 = CountHighbitsCollisions<unsigned_int>(hashes_00,nbHBits);
      bVar7 = CountHighbitsCollisions<unsigned_int>(hashes_00,nbHBits);
      bVar8 = TestHighbitsCollisions<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(in_ECX,in_R8D));
      local_e = (bVar7 && (bVar6 && (bVar5 && (bVar4 && (bVar3 && local_e))))) && bVar8;
    }
    if ((in_R9B & 1) != 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      local_88 = (uint *)0x0;
      while( true ) {
        __first._M_current = local_88;
        puVar10 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_80);
        if (puVar10 <= __first._M_current) break;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  (in_RDI,(size_type)local_88);
        in_stack_ffffffffffffff2c =
             bitreverse<unsigned_int>
                       ((uint)((ulong)__first._M_current >> 0x20),
                        CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&local_80,(size_type)local_88);
        *pvVar11 = in_stack_ffffffffffffff2c;
        local_88 = (uint *)((long)local_88 + 1);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_ffffffffffffff1f,
                          CONCAT16(in_stack_ffffffffffffff1e,
                                   CONCAT15(in_stack_ffffffffffffff1d,
                                            CONCAT14(in_stack_ffffffffffffff1c,
                                                     CONCAT13(in_stack_ffffffffffffff1b,
                                                              CONCAT12(in_stack_ffffffffffffff1a,
                                                                       in_stack_ffffffffffffff18))))
                                  )));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(in_stack_ffffffffffffff1f,
                          CONCAT16(in_stack_ffffffffffffff1e,
                                   CONCAT15(in_stack_ffffffffffffff1d,
                                            CONCAT14(in_stack_ffffffffffffff1c,
                                                     CONCAT13(in_stack_ffffffffffffff1b,
                                                              CONCAT12(in_stack_ffffffffffffff1a,
                                                                       in_stack_ffffffffffffff18))))
                                  )));
      __last._M_current._4_4_ = in_stack_ffffffffffffff2c;
      __last._M_current._0_4_ = in_stack_ffffffffffffff28;
      std::
      sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (__first,__last);
      bVar3 = CountLowbitsCollisions<unsigned_int>(hashes_00,nbHBits);
      bVar4 = CountLowbitsCollisions<unsigned_int>(hashes_00,nbHBits);
      bVar5 = CountLowbitsCollisions<unsigned_int>(hashes_00,nbHBits);
      bVar6 = CountLowbitsCollisions<unsigned_int>(hashes_00,nbHBits);
      bVar7 = CountLowbitsCollisions<unsigned_int>(hashes_00,nbHBits);
      bVar8 = TestLowbitsCollisions<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(in_ECX,in_R8D));
      local_e = (bVar7 & bVar6 & bVar5 & bVar4 & bVar3 & local_e & bVar8) != 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__first._M_current);
    }
    HashSet<unsigned_int>::~HashSet((HashSet<unsigned_int> *)0x1374ee);
  }
  if (uVar2 != 0) {
    bVar3 = TestDistribution<unsigned_int>
                      (in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7);
    local_e = (local_e & bVar3) != 0;
  }
  return local_e;
}

Assistant:

bool TestHashList ( std::vector<hashtype> & hashes, bool drawDiagram,
                    bool testCollision = true, bool testDist = true,
                    bool testHighBits = true, bool testLowBits = true )
{
  bool result = true;

  if (testCollision)
  {
    size_t const count = hashes.size();
    double const expected = EstimateNbCollisions(count, sizeof(hashtype) * 8);
    printf("Testing collisions (%3i-bit) - Expected %6.1f, ",
           (int)sizeof(hashtype)*8, expected);

    double collcount = 0;
    HashSet<hashtype> collisions;
    collcount = FindCollisions(hashes, collisions, 1000);
    printf("actual %6i (%.2fx)", (int)collcount, collcount / expected);

    if(sizeof(hashtype) == sizeof(uint32_t))
    {
    // 2x expected collisions = fail

    // #TODO - collision failure cutoff needs to be expressed as a standard deviation instead
    // of a scale factor, otherwise we fail erroneously if there are a small expected number
    // of collisions

        if ((collcount / expected) > 2.0)
        {
          printf(" !!!!!");
          result = false;
        }
    }
    else
    {
      // For all hashes larger than 32 bits, _any_ collisions are a failure.

      if(collcount > 0)
      {
        printf(" !!!!!");
        result = false;
        //if(drawDiagram) PrintCollisions(hashes, collisions);
      }
    }

    printf("\n");
    fflush(NULL);

    if (testHighBits) {
      result &= CountHighbitsCollisions(hashes, 224);
      result &= CountHighbitsCollisions(hashes, 160);
      result &= CountHighbitsCollisions(hashes, 128);
      result &= CountHighbitsCollisions(hashes,  64);
      result &= CountHighbitsCollisions(hashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountHighbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestHighbitsCollisions(hashes);

      /* Following tests are too small : tables are necessarily saturated.
       * It would be better to count the nb of collisions per Cell,
       * and compared the distribution of values against a random source.
       * But this is a different test */
      //result &= CountHighbitsCollisions(hashes,   12);
      //result &= CountHighbitsCollisions(hashes,   8);
    }
    if (testLowBits) {
      // reverse: bitwise flip the hashes. lowest bits first
      std::vector<hashtype> revhashes = hashes;
      for (size_t i = 0; i < revhashes.size(); i++) {
        revhashes[i] = bitreverse(hashes[i]);
      }
      std::sort(revhashes.begin(), revhashes.end());

      result &= CountLowbitsCollisions(revhashes, 224);
      result &= CountLowbitsCollisions(revhashes, 160);
      result &= CountLowbitsCollisions(revhashes, 128);
      result &= CountLowbitsCollisions(revhashes,  64);
      result &= CountLowbitsCollisions(revhashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountLowbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestLowbitsCollisions(revhashes);
      /* Following tests are too small : tables are necessarily saturated.
       * It would be better to count the nb of collisions per Cell,
       * and compared the distribution of values against a random source.
       * But this is a different test */
      //result &= CountLowbitsCollisions(revhashes,   12);
      //result &= CountLowbitsCollisions(revhashes,   8);

      //std::vector<hashtype>().swap(revhashes);
      //revhashes.clear();
    }
  }


  //----------

  if(testDist)
  {
    result &= TestDistribution(hashes,drawDiagram);
  }

  return result;
}